

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::Parser(Parser *this,Parser *that)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  
  (this->m_options).flags = (that->m_options).flags;
  sVar3 = (that->m_file).len;
  (this->m_file).str = (that->m_file).str;
  (this->m_file).len = sVar3;
  sVar3 = (that->m_buf).len;
  (this->m_buf).str = (that->m_buf).str;
  (this->m_buf).len = sVar3;
  this->m_root_id = that->m_root_id;
  this->m_tree = that->m_tree;
  detail::stack<c4::yml::Parser::State,_16UL>::stack(&this->m_stack,&that->m_stack);
  sVar3 = (this->m_stack).m_size;
  if (sVar3 == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_00231528)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    sVar3 = (this->m_stack).m_size;
  }
  this->m_state = (this->m_stack).m_stack + (sVar3 - 1);
  sVar3 = that->m_key_tag2_indentation;
  this->m_key_tag_indentation = that->m_key_tag_indentation;
  this->m_key_tag2_indentation = sVar3;
  sVar3 = (that->m_key_tag).len;
  (this->m_key_tag).str = (that->m_key_tag).str;
  (this->m_key_tag).len = sVar3;
  sVar3 = (that->m_key_tag2).len;
  (this->m_key_tag2).str = (that->m_key_tag2).str;
  (this->m_key_tag2).len = sVar3;
  this->m_val_tag_indentation = that->m_val_tag_indentation;
  sVar3 = (that->m_val_tag).len;
  (this->m_val_tag).str = (that->m_val_tag).str;
  (this->m_val_tag).len = sVar3;
  this->m_key_anchor_was_before = that->m_key_anchor_was_before;
  this->m_key_anchor_indentation = that->m_key_anchor_indentation;
  sVar3 = (that->m_key_anchor).len;
  (this->m_key_anchor).str = (that->m_key_anchor).str;
  (this->m_key_anchor).len = sVar3;
  this->m_val_anchor_indentation = that->m_val_anchor_indentation;
  sVar3 = (that->m_val_anchor).len;
  (this->m_val_anchor).str = (that->m_val_anchor).str;
  (this->m_val_anchor).len = sVar3;
  sVar3 = (that->m_filter_arena).len;
  (this->m_filter_arena).str = (that->m_filter_arena).str;
  (this->m_filter_arena).len = sVar3;
  this->m_newline_offsets = that->m_newline_offsets;
  sVar3 = that->m_newline_offsets_capacity;
  this->m_newline_offsets_size = that->m_newline_offsets_size;
  this->m_newline_offsets_capacity = sVar3;
  sVar3 = (that->m_newline_offsets_buf).len;
  (this->m_newline_offsets_buf).str = (that->m_newline_offsets_buf).str;
  (this->m_newline_offsets_buf).len = sVar3;
  (that->m_options).flags = 0;
  (that->m_stack).m_size = 0;
  that->m_root_id = 0;
  that->m_tree = (Tree *)0x0;
  (that->m_buf).str = (char *)0x0;
  (that->m_buf).len = 0;
  (that->m_file).str = (char *)0x0;
  (that->m_file).len = 0;
  (that->m_val_tag).str = (char *)0x0;
  (that->m_val_tag).len = 0;
  (that->m_key_tag2).len = 0;
  that->m_val_tag_indentation = 0;
  (that->m_key_tag).len = 0;
  (that->m_key_tag2).str = (char *)0x0;
  that->m_key_tag2_indentation = 0;
  (that->m_key_tag).str = (char *)0x0;
  that->m_state = (State *)0x0;
  that->m_key_tag_indentation = 0;
  that->m_key_anchor_was_before = false;
  that->m_key_anchor_indentation = 0;
  (that->m_key_anchor).str = (char *)0x0;
  (that->m_key_anchor).len = 0;
  that->m_val_anchor_indentation = 0;
  (that->m_val_anchor).str = (char *)0x0;
  (that->m_val_anchor).len = 0;
  (that->m_filter_arena).str = (char *)0x0;
  (that->m_filter_arena).len = 0;
  that->m_newline_offsets = (size_t *)0x0;
  that->m_newline_offsets_size = 0;
  that->m_newline_offsets_capacity = 0;
  (that->m_newline_offsets_buf).str = (char *)0x0;
  (that->m_newline_offsets_buf).len = 0;
  return;
}

Assistant:

Parser::Parser(Parser &&that)
    : m_options(that.m_options)
    , m_file(that.m_file)
    , m_buf(that.m_buf)
    , m_root_id(that.m_root_id)
    , m_tree(that.m_tree)
    , m_stack(std::move(that.m_stack))
    , m_state(&m_stack.top())
    , m_key_tag_indentation(that.m_key_tag_indentation)
    , m_key_tag2_indentation(that.m_key_tag2_indentation)
    , m_key_tag(that.m_key_tag)
    , m_key_tag2(that.m_key_tag2)
    , m_val_tag_indentation(that.m_val_tag_indentation)
    , m_val_tag(that.m_val_tag)
    , m_key_anchor_was_before(that.m_key_anchor_was_before)
    , m_key_anchor_indentation(that.m_key_anchor_indentation)
    , m_key_anchor(that.m_key_anchor)
    , m_val_anchor_indentation(that.m_val_anchor_indentation)
    , m_val_anchor(that.m_val_anchor)
    , m_filter_arena(that.m_filter_arena)
    , m_newline_offsets(that.m_newline_offsets)
    , m_newline_offsets_size(that.m_newline_offsets_size)
    , m_newline_offsets_capacity(that.m_newline_offsets_capacity)
    , m_newline_offsets_buf(that.m_newline_offsets_buf)
{
    that._clr();
}